

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O0

VMFunction * PClass::FindFunction(FName *clsname,FName *funcname)

{
  PClass *pPVar1;
  DObject *p;
  Variant *pVVar2;
  FName local_3c;
  PFunction *local_38;
  PFunction *func;
  PClassActor *local_28;
  PClassActor *cls;
  FName *funcname_local;
  FName *clsname_local;
  
  cls = (PClassActor *)funcname;
  funcname_local = clsname;
  FName::FName((FName *)((long)&func + 4),clsname);
  local_28 = FindActor((FName *)((long)&func + 4));
  if (local_28 == (PClassActor *)0x0) {
    clsname_local = (FName *)0x0;
  }
  else {
    pPVar1 = &local_28->super_PClass;
    FName::FName(&local_3c,funcname);
    p = (DObject *)
        PSymbolTable::FindSymbol
                  (&(pPVar1->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType
                    .super_PType.Symbols,&local_3c,true);
    local_38 = dyn_cast<PFunction>(p);
    if (local_38 == (PFunction *)0x0) {
      clsname_local = (FName *)0x0;
    }
    else {
      pVVar2 = TArray<PFunction::Variant,_PFunction::Variant>::operator[](&local_38->Variants,0);
      clsname_local = (FName *)pVVar2->Implementation;
    }
  }
  return (VMFunction *)clsname_local;
}

Assistant:

VMFunction *PClass::FindFunction(FName clsname, FName funcname)
{
	auto cls = PClass::FindActor(clsname);
	if (!cls) return nullptr;
	auto func = dyn_cast<PFunction>(cls->Symbols.FindSymbol(funcname, true));
	if (!func) return nullptr;
	return func->Variants[0].Implementation;
}